

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavaOPL3.hpp
# Opt level: O1

void __thiscall ADL_JavaOPL3::OPL3::initChannels2op(OPL3 *this)

{
  Operator *pOVar1;
  Operator *pOVar2;
  double dVar3;
  int iVar4;
  Channel2op *pCVar5;
  Operator **ppOVar6;
  long lVar7;
  int channelNumber;
  long lVar8;
  int iVar9;
  Channel2op **ppCVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  
  iVar9 = 0;
  memset(this->channels2op,0,0x90);
  if (this->FullPan == false) {
    uVar12 = 0;
    uVar13 = 0x3ff00000;
  }
  else {
    uVar12 = 0x667e556e;
    uVar13 = 0x3fe6a09e;
  }
  ppCVar10 = this->channels2op[0] + 6;
  ppOVar6 = this->operators[0] + 0x13;
  dVar3 = (double)CONCAT44(uVar13,uVar12);
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      pCVar5 = (Channel2op *)operator_new(0x60);
      pOVar1 = ppOVar6[lVar8 + -0x13];
      pOVar2 = ppOVar6[lVar8 + -0x10];
      iVar4 = (int)lVar8;
      (pCVar5->super_Channel).channelBaseAddress = iVar9 + iVar4;
      (pCVar5->super_Channel).feedback[0] = 0.0;
      (pCVar5->super_Channel).feedback[1] = 0.0;
      (pCVar5->super_Channel).fnuml = 0;
      (pCVar5->super_Channel).fnumh = 0;
      (pCVar5->super_Channel).kon = 0;
      (pCVar5->super_Channel).block = 0;
      (pCVar5->super_Channel).fb = 0;
      (pCVar5->super_Channel).cha = 0;
      (pCVar5->super_Channel).chb = 0;
      (pCVar5->super_Channel).cnt = 0;
      (pCVar5->super_Channel).rightPan = dVar3;
      (pCVar5->super_Channel).leftPan = dVar3;
      (pCVar5->super_Channel)._vptr_Channel = (_func_int **)&PTR__Channel_0021d9e8;
      pCVar5->op1 = pOVar1;
      pCVar5->op2 = pOVar2;
      ppCVar10[lVar8 + -6] = pCVar5;
      pCVar5 = (Channel2op *)operator_new(0x60);
      pOVar1 = ppOVar6[lVar8 + -0xb];
      pOVar2 = ppOVar6[lVar8 + -8];
      (pCVar5->super_Channel).channelBaseAddress = iVar9 + iVar4 + 3;
      (pCVar5->super_Channel).feedback[0] = 0.0;
      (pCVar5->super_Channel).feedback[1] = 0.0;
      (pCVar5->super_Channel).fnuml = 0;
      (pCVar5->super_Channel).fnumh = 0;
      (pCVar5->super_Channel).kon = 0;
      (pCVar5->super_Channel).block = 0;
      (pCVar5->super_Channel).fb = 0;
      (pCVar5->super_Channel).cha = 0;
      (pCVar5->super_Channel).chb = 0;
      (pCVar5->super_Channel).cnt = 0;
      (pCVar5->super_Channel).rightPan = dVar3;
      (pCVar5->super_Channel).leftPan = dVar3;
      (pCVar5->super_Channel)._vptr_Channel = (_func_int **)&PTR__Channel_0021d9e8;
      pCVar5->op1 = pOVar1;
      pCVar5->op2 = pOVar2;
      ppCVar10[lVar8 + -3] = pCVar5;
      pCVar5 = (Channel2op *)operator_new(0x60);
      pOVar1 = ppOVar6[lVar8 + -3];
      pOVar2 = ppOVar6[lVar8];
      (pCVar5->super_Channel).channelBaseAddress = iVar9 + 6 + iVar4;
      (pCVar5->super_Channel).feedback[0] = 0.0;
      (pCVar5->super_Channel).feedback[1] = 0.0;
      (pCVar5->super_Channel).fnuml = 0;
      (pCVar5->super_Channel).fnumh = 0;
      (pCVar5->super_Channel).kon = 0;
      (pCVar5->super_Channel).block = 0;
      (pCVar5->super_Channel).fb = 0;
      (pCVar5->super_Channel).cha = 0;
      (pCVar5->super_Channel).chb = 0;
      (pCVar5->super_Channel).cnt = 0;
      (pCVar5->super_Channel).rightPan = dVar3;
      (pCVar5->super_Channel).leftPan = dVar3;
      (pCVar5->super_Channel)._vptr_Channel = (_func_int **)&PTR__Channel_0021d9e8;
      pCVar5->op1 = pOVar1;
      pCVar5->op2 = pOVar2;
      ppCVar10[lVar8] = pCVar5;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    ppCVar10 = ppCVar10 + 9;
    ppOVar6 = ppOVar6 + 0x20;
    iVar9 = iVar9 + 0x100;
    bVar11 = lVar7 == 0;
    lVar7 = lVar7 + 1;
  } while (bVar11);
  return;
}

Assistant:

void OPL3::initChannels2op() {
    // The YMF262 has 18 2-op channels.
    // Each 2-op channel can be at a serial or parallel operator configuration:
    memset(channels2op, 0, sizeof(channels2op));
	double startvol = FullPan ? CENTER_PANNING_POWER : 1;
    for(int array=0; array<2; array++)
        for(int channelNumber=0; channelNumber<3; channelNumber++) {
            int baseAddress = (array<<8) | channelNumber;
            // Channels 1, 2, 3 -> Operator offsets 0x0,0x3; 0x1,0x4; 0x2,0x5
            channels2op[array][channelNumber]   = new Channel2op(baseAddress, startvol, operators[array][channelNumber], operators[array][channelNumber+0x3]);
            // Channels 4, 5, 6 -> Operator offsets 0x8,0xB; 0x9,0xC; 0xA,0xD
            channels2op[array][channelNumber+3] = new Channel2op(baseAddress+3, startvol, operators[array][channelNumber+0x8], operators[array][channelNumber+0xB]);
            // Channels 7, 8, 9 -> Operators 0x10,0x13; 0x11,0x14; 0x12,0x15
            channels2op[array][channelNumber+6] = new Channel2op(baseAddress+6, startvol, operators[array][channelNumber+0x10], operators[array][channelNumber+0x13]);
        }   
}